

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O1

void cuddCacheFlush(DdManager *table)

{
  uint uVar1;
  DdCache *pDVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = table->cacheSlots;
  if (0 < (long)(int)uVar1) {
    pDVar2 = table->cache;
    dVar4 = table->cachedeletions;
    lVar3 = 0;
    do {
      dVar5 = 1.0;
      if (*(long *)((long)&pDVar2->data + lVar3) == 0) {
        dVar5 = 0.0;
      }
      dVar4 = dVar4 + dVar5;
      *(undefined8 *)((long)&pDVar2->data + lVar3) = 0;
      lVar3 = lVar3 + 0x28;
    } while ((long)(int)uVar1 * 0x28 != lVar3);
    table->cachedeletions = dVar4;
  }
  table->cacheLastInserts = table->cacheinserts;
  return;
}

Assistant:

void
cuddCacheFlush(
  DdManager * table)
{
    int i, slots;
    DdCache *cache;

    slots = table->cacheSlots;
    cache = table->cache;
    for (i = 0; i < slots; i++) {
        table->cachedeletions += cache[i].data != NULL;
        cache[i].data = NULL;
    }
    table->cacheLastInserts = table->cacheinserts;

    return;

}